

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O3

int main(int argc,char **argv)

{
  functest p_Var1;
  testDesc *ptVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  code *__s1;
  uint uVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  bool bVar12;
  
  memset(filling,0x61,0x1000);
  filling[0x1000] = '\0';
  xmlMemSetup(xmlMemFree,xmlMemMalloc,xmlMemRealloc,xmlMemoryStrdup);
  xmlInitParser();
  xmlInitializeCatalog();
  xmlCatalogSetDefaults(0);
  __s1 = hugeMatch;
  iVar4 = xmlRegisterInputCallbacks(hugeMatch,hugeOpen,hugeRead,hugeClose);
  if (iVar4 < 0) {
    main_cold_2();
LAB_001027ba:
    main_cold_1();
    if ((__s1 != (code *)0x0) && (iVar4 = strncmp((char *)__s1,"huge:",5), iVar4 == 0)) {
      return 1;
    }
    return 0;
  }
  __s1 = crazyMatch;
  iVar4 = xmlRegisterInputCallbacks(crazyMatch,crazyOpen,crazyRead,crazyClose);
  if (iVar4 < 0) goto LAB_001027ba;
  if (1 < argc) {
    bVar12 = false;
    uVar11 = 1;
    do {
      pcVar10 = argv[uVar11];
      if (((*pcVar10 == '-') && (pcVar10[1] == 'v')) && (pcVar10[2] == '\0')) {
        verbose = '\x01';
      }
      else {
        iVar4 = strcmp(pcVar10,"-quiet");
        if (iVar4 == 0) {
          tests_quiet = '\x01';
        }
        else {
          iVar4 = strcmp(pcVar10,"-crazy");
          if (iVar4 == 0) {
            bVar12 = true;
          }
        }
      }
      uVar11 = uVar11 + 1;
    } while ((uint)argc != uVar11);
    if (bVar12) goto LAB_001025c5;
  }
  ptVar2 = testDescriptions;
  lVar7 = 0;
  do {
    iVar3 = nb_tests;
    iVar4 = nb_errors;
    if ((tests_quiet == '\0') && (testDescriptions[lVar7].desc != (char *)0x0)) {
      printf("## %s\n");
    }
    p_Var1 = ptVar2->func;
    lVar9 = 0;
    do {
      iVar5 = 0;
      if (lVar9 != 0x18 || lVar7 != 0) {
        iVar5 = *(int *)((long)&limitDescriptions[0].fail + lVar9);
      }
      iVar5 = (*p_Var1)(*(char **)((long)&limitDescriptions[0].name + lVar9),
                        *(size_t *)((long)&limitDescriptions[0].limit + lVar9),
                        *(int *)((long)&limitDescriptions[0].options + lVar9),iVar5);
      if (iVar5 != 0) {
        nb_errors = nb_errors + 1;
      }
      lVar9 = lVar9 + 0x18;
    } while (lVar9 != 0x120);
    if (verbose == '\x01') {
      if (nb_errors - iVar4 == 0) {
        printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar3));
      }
      else {
        printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar3),
               (ulong)(uint)(nb_errors - iVar4),0);
      }
    }
    lVar7 = lVar7 + 1;
    ptVar2 = testDescriptions + lVar7;
  } while (lVar7 != 2);
LAB_001025c5:
  iVar3 = nb_tests;
  iVar4 = nb_errors;
  if (tests_quiet == '\0') {
    puts("## Crazy tests on reader");
  }
  pcVar10 = crazy;
  if (*crazy != '\0') {
    uVar8 = 1;
    uVar11 = 0;
    do {
      iVar5 = get_crazy_fail(uVar8 - 1);
      crazy_indx = uVar8 - 1;
      iVar5 = readerTest("crazy::test",0x988680,0,iVar5);
      if (iVar5 != 0) {
        nb_errors = nb_errors + 1;
      }
      if (tests_quiet == '\0') {
        fputc((int)crazy[uVar11],_stderr);
      }
      pcVar10 = crazy;
      uVar11 = (ulong)uVar8;
      sVar6 = strlen(crazy);
      uVar8 = uVar8 + 1;
    } while (uVar11 < sVar6);
  }
  if (tests_quiet == '\0') {
    puts("\n## Crazy tests on SAX");
    pcVar10 = crazy;
  }
  if (*pcVar10 != '\0') {
    uVar8 = 1;
    uVar11 = 0;
    do {
      iVar5 = get_crazy_fail(uVar8 - 1);
      crazy_indx = uVar8 - 1;
      iVar5 = saxTest("crazy::test",0x988680,0,iVar5);
      if (iVar5 != 0) {
        nb_errors = nb_errors + 1;
      }
      if (tests_quiet == '\0') {
        fputc((int)crazy[uVar11],_stderr);
      }
      uVar11 = (ulong)uVar8;
      sVar6 = strlen(crazy);
      uVar8 = uVar8 + 1;
    } while (uVar11 < sVar6);
  }
  if (tests_quiet == '\0') {
    fputc(10,_stderr);
  }
  if (verbose == '\x01') {
    if (nb_errors - iVar4 == 0) {
      printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar3));
    }
    else {
      printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar3),
             (ulong)(uint)(nb_errors - iVar4),0);
    }
  }
  bVar12 = nb_errors == 0;
  if (bVar12) {
    printf("Total %d tests, no errors\n",(ulong)(uint)nb_tests);
  }
  else {
    printf("Total %d tests, %d errors, %d leaks\n",(ulong)(uint)nb_tests,(ulong)(uint)nb_errors,0);
  }
  xmlCleanupParser();
  return (uint)!bVar12;
}

Assistant:

int
main(int argc ATTRIBUTE_UNUSED, char **argv ATTRIBUTE_UNUSED) {
    int i, a, ret = 0;
    int subset = 0;

    fillFilling();
    initializeLibxml2();

    for (a = 1; a < argc;a++) {
        if (!strcmp(argv[a], "-v"))
	    verbose = 1;
        else if (!strcmp(argv[a], "-quiet"))
	    tests_quiet = 1;
        else if (!strcmp(argv[a], "-crazy"))
	    subset = 1;
    }
    if (subset == 0) {
	for (i = 0; testDescriptions[i].func != NULL; i++) {
	    ret += runtest(i);
	}
    }
    ret += runcrazy();
    if ((nb_errors == 0) && (nb_leaks == 0)) {
        ret = 0;
	printf("Total %d tests, no errors\n",
	       nb_tests);
    } else {
        ret = 1;
	printf("Total %d tests, %d errors, %d leaks\n",
	       nb_tests, nb_errors, nb_leaks);
    }
    xmlCleanupParser();

    return(ret);
}